

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

SQBool __thiscall RefTable::Release(RefTable *this,SQObject *obj)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  RefNode *pRVar4;
  RefNode **ppRVar5;
  SQBool SVar6;
  SQObjectPtr o;
  RefNode *prev;
  SQHash mainpos;
  SQObjectPtr local_30;
  RefNode *local_20;
  SQHash local_18;
  
  SVar6 = 0;
  pRVar4 = Get(this,obj,&local_18,&local_20,false);
  if (pRVar4 != (RefNode *)0x0) {
    pSVar1 = &pRVar4->refs;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      local_30.super_SQObject._type = (pRVar4->obj).super_SQObject._type;
      local_30.super_SQObject._unVal = (SQObjectValue)(pRVar4->obj).super_SQObject._unVal.pTable;
      if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      ppRVar5 = &local_20->next;
      if (local_20 == (RefNode *)0x0) {
        ppRVar5 = this->_buckets + local_18;
      }
      *ppRVar5 = pRVar4->next;
      pRVar4->next = this->_freelist;
      this->_freelist = pRVar4;
      this->_slotused = this->_slotused - 1;
      pSVar3 = (pRVar4->obj).super_SQObject._unVal.pTable;
      SVar2 = (pRVar4->obj).super_SQObject._type;
      (pRVar4->obj).super_SQObject._type = OT_NULL;
      (pRVar4->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      SQObjectPtr::~SQObjectPtr(&local_30);
      SVar6 = 1;
    }
    else {
      SVar6 = 0;
    }
  }
  return SVar6;
}

Assistant:

SQBool RefTable::Release(SQObject &obj)
{
    SQHash mainpos;
    RefNode *prev;
    RefNode *ref = Get(obj,mainpos,&prev,false);
    if(ref) {
        if(--ref->refs == 0) {
            SQObjectPtr o = ref->obj;
            if(prev) {
                prev->next = ref->next;
            }
            else {
                _buckets[mainpos] = ref->next;
            }
            ref->next = _freelist;
            _freelist = ref;
            _slotused--;
            ref->obj.Null();
            //<<FIXME>>test for shrink?
            return SQTrue;
        }
    }
    else {
        assert(0);
    }
    return SQFalse;
}